

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu.cpp
# Opt level: O0

void M_SetMenu(FName *menu,int param)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  FSkillInfo *pFVar5;
  char *pcVar6;
  FListMenuItem **ppFVar7;
  DMenu *menu_00;
  PClass *local_108;
  PClass *local_100;
  char *local_c0;
  char *local_b8;
  DMenu *newmenu_2;
  PClass *local_90;
  PClass *menuclass;
  DOptionMenu *newmenu_1;
  PClass *cls_1;
  FOptionMenuDescriptor *ld_1;
  DListMenu *newmenu;
  PClass *cls;
  FListMenuDescriptor *ld;
  FMenuDescriptor **local_50;
  FMenuDescriptor **desc;
  char *local_40;
  char *msg;
  byte local_21;
  undefined1 local_20 [20];
  int param_local;
  FName *menu_local;
  
  local_20._12_4_ = param;
  unique0x10000834 = (DObject *)menu;
  iVar3 = FName::operator_cast_to_int(menu);
  switch(iVar3) {
  case 0x1d6:
    GameStartupInfo.Skill = -1;
    GameStartupInfo.Episode = -1;
    local_21 = 0;
    if (local_20._12_4_ == -1000) {
      local_b8 = (char *)0x0;
    }
    else {
      if (local_20._12_4_ == -1) {
        local_c0 = "Random";
      }
      else {
        TArray<FPlayerClass,_FPlayerClass>::operator[](&PlayerClasses,(long)(int)local_20._12_4_);
        GetPrintableDisplayName((PClassPlayerPawn *)local_20);
        local_21 = 1;
        local_c0 = FString::GetChars((FString *)local_20);
      }
      local_b8 = local_c0;
    }
    GameStartupInfo.PlayerClass = local_b8;
    if ((local_21 & 1) != 0) {
      FString::~FString((FString *)local_20);
    }
    break;
  case 0x1d9:
    if (((gameinfo.flags & 2U) != 0) && (0 < (int)local_20._12_4_)) {
      pcVar6 = FStringTable::operator()(&GStrings,"SWSTRING");
      FName::FName((FName *)&msg,NAME_None);
      M_StartMessage(pcVar6,1,(FName *)&msg);
      return;
    }
    GameStartupInfo.Episode = local_20._12_4_;
    M_StartupSkillMenu(&GameStartupInfo);
    break;
  case 0x1da:
    GameStartupInfo.Skill = local_20._12_4_;
  case 0x1dc:
    G_DeferedInitNew(&GameStartupInfo);
    if (gamestate == GS_FULLCONSOLE) {
      gamestate = GS_HIDECONSOLE;
      gameaction = ga_newgame;
    }
    M_ClearMenus();
    return;
  case 0x1db:
    GameStartupInfo.Skill = local_20._12_4_;
    pFVar5 = TArray<FSkillInfo,_FSkillInfo>::operator[](&AllSkills,(long)(int)local_20._12_4_);
    local_40 = FString::operator_cast_to_char_(&pFVar5->MustConfirmText);
    if (*local_40 == '\0') {
      local_40 = FStringTable::operator()(&GStrings,"NIGHTMARE");
    }
    pcVar6 = local_40;
    FName::FName((FName *)((long)&desc + 4),NAME_StartgameConfirmed);
    M_StartMessage(pcVar6,0,(FName *)((long)&desc + 4));
    return;
  case 0x1de:
    if (((usergame & 1U) == 0) ||
       ((((int)(&DAT_00d634f8)[(long)consoleplayer * 0xa8] < 1 && ((multiplayer & 1U) == 0)) ||
        (gamestate != GS_LEVEL)))) {
      pcVar6 = FStringTable::operator()(&GStrings,"SAVEDEAD");
      FName::FName((FName *)&desc,NAME_None);
      M_StartMessage(pcVar6,1,(FName *)&desc);
      return;
    }
  }
  FName::FName((FName *)((long)&ld + 4),menu);
  local_50 = TMap<FName,_FMenuDescriptor_*,_THashTraits<FName>,_TValueTraits<FMenuDescriptor_*>_>::
             CheckKey(&MenuDescriptors,(FName *)((long)&ld + 4));
  if (local_50 == (FMenuDescriptor **)0x0) {
    FName::FName((FName *)((long)&newmenu_2 + 4),menu);
    local_90 = PClass::FindClass((FName *)((long)&newmenu_2 + 4));
    if ((local_90 == (PClass *)0x0) ||
       (bVar2 = PClass::IsDescendantOf(local_90,DMenu::RegistrationInfo.MyClass), !bVar2)) {
      pcVar6 = FName::GetChars(menu);
      Printf("Attempting to open menu of unknown type \'%s\'\n",pcVar6);
      M_ClearMenus();
    }
    else {
      menu_00 = (DMenu *)PClass::CreateNew(local_90);
      TObjPtr<DMenu>::operator=(&menu_00->mParentMenu,DMenu::CurrentMenu);
      M_ActivateMenu(menu_00);
    }
  }
  else {
    bVar2 = FString::IsNotEmpty(&(*local_50)->mNetgameMessage);
    if (((bVar2) && ((netgame & 1U) != 0)) && ((demoplayback & 1U) == 0)) {
      pcVar6 = FString::operator_cast_to_char_(&(*local_50)->mNetgameMessage);
      FName::FName((FName *)&ld,NAME_None);
      M_StartMessage(pcVar6,1,(FName *)&ld);
    }
    else if ((*local_50)->mType == 0) {
      cls = (PClass *)*local_50;
      if (((int)(cls->super_PStruct).super_PNamedType.super_PCompoundType.super_PType.Conversions.
                Most < 0) ||
         (uVar1 = (cls->super_PStruct).super_PNamedType.super_PCompoundType.super_PType.Conversions.
                  Most,
         uVar4 = TArray<FListMenuItem_*,_FListMenuItem_*>::Size
                           ((TArray<FListMenuItem_*,_FListMenuItem_*> *)
                            &(cls->super_PStruct).super_PNamedType.super_PCompoundType.super_PType.
                             Align), (int)uVar4 <= (int)uVar1)) {
        if (*(long *)&(cls->super_PStruct).super_PNamedType.super_PCompoundType.super_PType.
                      super_DObject.ObjectFlags == 0) {
          local_100 = DListMenu::RegistrationInfo.MyClass;
        }
        else {
          local_100 = *(PClass **)
                       &(cls->super_PStruct).super_PNamedType.super_PCompoundType.super_PType.
                        super_DObject.ObjectFlags;
        }
        newmenu = (DListMenu *)local_100;
        ld_1 = (FOptionMenuDescriptor *)PClass::CreateNew(local_100);
        (*(ld_1->super_FMenuDescriptor)._vptr_FMenuDescriptor[0xf])(ld_1,DMenu::CurrentMenu,cls);
        M_ActivateMenu((DMenu *)ld_1);
      }
      else {
        ppFVar7 = TArray<FListMenuItem_*,_FListMenuItem_*>::operator[]
                            ((TArray<FListMenuItem_*,_FListMenuItem_*> *)
                             &(cls->super_PStruct).super_PNamedType.super_PCompoundType.super_PType.
                              Align,(long)(int)(cls->super_PStruct).super_PNamedType.
                                               super_PCompoundType.super_PType.Conversions.Most);
        (*(*ppFVar7)->_vptr_FListMenuItem[6])();
      }
    }
    else if ((*local_50)->mType == 1) {
      cls_1 = (PClass *)*local_50;
      if (*(PClass **)
           &(cls_1->super_PStruct).super_PNamedType.super_PCompoundType.super_PType.super_DObject.
            ObjectFlags == (PClass *)0x0) {
        local_108 = DOptionMenu::RegistrationInfo.MyClass;
      }
      else {
        local_108 = *(PClass **)
                     &(cls_1->super_PStruct).super_PNamedType.super_PCompoundType.super_PType.
                      super_DObject.ObjectFlags;
      }
      newmenu_1 = (DOptionMenu *)local_108;
      menuclass = (PClass *)PClass::CreateNew(local_108);
      (*(menuclass->super_PStruct).super_PNamedType.super_PCompoundType.super_PType.super_DObject.
        _vptr_DObject[0xf])(menuclass,DMenu::CurrentMenu,cls_1);
      M_ActivateMenu((DMenu *)menuclass);
    }
  }
  return;
}

Assistant:

void M_SetMenu(FName menu, int param)
{
	// some menus need some special treatment
	switch (menu)
	{
	case NAME_Episodemenu:
		// sent from the player class menu
		GameStartupInfo.Skill = -1;
		GameStartupInfo.Episode = -1;
		GameStartupInfo.PlayerClass = 
			param == -1000? NULL :
			param == -1? "Random" : GetPrintableDisplayName(PlayerClasses[param].Type).GetChars();
		break;

	case NAME_Skillmenu:
		// sent from the episode menu

		if ((gameinfo.flags & GI_SHAREWARE) && param > 0)
		{
			// Only Doom and Heretic have multi-episode shareware versions.
			M_StartMessage(GStrings("SWSTRING"), 1);
			return;
		}

		GameStartupInfo.Episode = param;
		M_StartupSkillMenu(&GameStartupInfo);	// needs player class name from class menu (later)
		break;

	case NAME_StartgameConfirm:
	{
		// sent from the skill menu for a skill that needs to be confirmed
		GameStartupInfo.Skill = param;

		const char *msg = AllSkills[param].MustConfirmText;
		if (*msg==0) msg = GStrings("NIGHTMARE");
		M_StartMessage (msg, 0, NAME_StartgameConfirmed);
		return;
	}

	case NAME_Startgame:
		// sent either from skill menu or confirmation screen. Skill gets only set if sent from skill menu
		// Now we can finally start the game. Ugh...
		GameStartupInfo.Skill = param;
	case NAME_StartgameConfirmed:

		G_DeferedInitNew (&GameStartupInfo);
		if (gamestate == GS_FULLCONSOLE)
		{
			gamestate = GS_HIDECONSOLE;
			gameaction = ga_newgame;
		}
		M_ClearMenus ();
		return;

	case NAME_Savegamemenu:
		if (!usergame || (players[consoleplayer].health <= 0 && !multiplayer) || gamestate != GS_LEVEL)
		{
			// cannot save outside the game.
			M_StartMessage (GStrings("SAVEDEAD"), 1);
			return;
		}
	}

	// End of special checks

	FMenuDescriptor **desc = MenuDescriptors.CheckKey(menu);
	if (desc != NULL)
	{
		if ((*desc)->mNetgameMessage.IsNotEmpty() && netgame && !demoplayback)
		{
			M_StartMessage((*desc)->mNetgameMessage, 1);
			return;
		}

		if ((*desc)->mType == MDESC_ListMenu)
		{
			FListMenuDescriptor *ld = static_cast<FListMenuDescriptor*>(*desc);
			if (ld->mAutoselect >= 0 && ld->mAutoselect < (int)ld->mItems.Size())
			{
				// recursively activate the autoselected item without ever creating this menu.
				ld->mItems[ld->mAutoselect]->Activate();
			}
			else
			{
				const PClass *cls = ld->mClass == NULL? RUNTIME_CLASS(DListMenu) : ld->mClass;

				DListMenu *newmenu = (DListMenu *)cls->CreateNew();
				newmenu->Init(DMenu::CurrentMenu, ld);
				M_ActivateMenu(newmenu);
			}
		}
		else if ((*desc)->mType == MDESC_OptionsMenu)
		{
			FOptionMenuDescriptor *ld = static_cast<FOptionMenuDescriptor*>(*desc);
			const PClass *cls = ld->mClass == NULL? RUNTIME_CLASS(DOptionMenu) : ld->mClass;

			DOptionMenu *newmenu = (DOptionMenu *)cls->CreateNew();
			newmenu->Init(DMenu::CurrentMenu, ld);
			M_ActivateMenu(newmenu);
		}
		return;
	}
	else
	{
		const PClass *menuclass = PClass::FindClass(menu);
		if (menuclass != NULL)
		{
			if (menuclass->IsDescendantOf(RUNTIME_CLASS(DMenu)))
			{
				DMenu *newmenu = (DMenu*)menuclass->CreateNew();
				newmenu->mParentMenu = DMenu::CurrentMenu;
				M_ActivateMenu(newmenu);
				return;
			}
		}
	}
	Printf("Attempting to open menu of unknown type '%s'\n", menu.GetChars());
	M_ClearMenus();
}